

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

int secp256k1_scalar_cond_negate(secp256k1_scalar *r,int flag)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar4 = 0;
  bVar13 = flag != 0;
  uVar10 = 0xbfd25e8cd0364142;
  if (!bVar13) {
    uVar10 = uVar4;
  }
  uVar11 = 0xbaaedce6af48a03b;
  if (!bVar13) {
    uVar11 = uVar4;
  }
  uVar8 = 0xfffffffffffffffe;
  if (!bVar13) {
    uVar8 = uVar4;
  }
  uVar12 = -(ulong)bVar13;
  iVar3 = secp256k1_scalar_is_zero(r);
  uVar6 = r->d[0] ^ uVar12;
  uVar7 = r->d[1] ^ uVar12;
  uVar9 = r->d[2] ^ uVar12;
  uVar4 = r->d[3];
  uVar1 = (ulong)CARRY8(uVar6,uVar10);
  uVar2 = uVar7 + uVar11;
  uVar11 = (ulong)(CARRY8(uVar7,uVar11) || CARRY8(uVar2,uVar1));
  uVar7 = uVar9 + uVar8;
  uVar5 = (ulong)(iVar3 + -1);
  r->d[0] = uVar6 + uVar10 & uVar5;
  r->d[1] = uVar2 + uVar1 & uVar5;
  r->d[2] = uVar7 + uVar11 & uVar5;
  r->d[3] = ((uVar12 ^ uVar4) - (ulong)bVar13) +
            (ulong)(CARRY8(uVar9,uVar8) || CARRY8(uVar7,uVar11)) & uVar5;
  return -(uint)bVar13 | 1;
}

Assistant:

static int secp256k1_scalar_cond_negate(secp256k1_scalar *r, int flag) {
    /* If we are flag = 0, mask = 00...00 and this is a no-op;
     * if we are flag = 1, mask = 11...11 and this is identical to secp256k1_scalar_negate */
    uint64_t mask = !flag - 1;
    uint64_t nonzero = (secp256k1_scalar_is_zero(r) != 0) - 1;
    uint128_t t = (uint128_t)(r->d[0] ^ mask) + ((SECP256K1_N_0 + 1) & mask);
    r->d[0] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[1] ^ mask) + (SECP256K1_N_1 & mask);
    r->d[1] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[2] ^ mask) + (SECP256K1_N_2 & mask);
    r->d[2] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[3] ^ mask) + (SECP256K1_N_3 & mask);
    r->d[3] = t & nonzero;
    return 2 * (mask == 0) - 1;
}